

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O1

void Gia_ObjComputeTruthTable6_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Wrd_t *vTruths)

{
  uint uVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  
  pGVar3 = p->pObjs;
  if ((pObj < pGVar3) || (pGVar3 + p->nObjs <= pObj)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  iVar7 = (int)((long)pObj - (long)pGVar3 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar7) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  if (p->pTravIds[iVar7] == p->nTravIds) {
    return;
  }
  p->pTravIds[iVar7] = p->nTravIds;
  uVar8 = (uint)*(undefined8 *)pObj;
  if ((uVar8 >> 0x1e & 1) != 0) {
    __assert_fail("!pObj->fMark0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                  ,0x6d,"void Gia_ObjComputeTruthTable6_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Wrd_t *)")
    ;
  }
  if ((-1 < (int)uVar8) && ((uVar8 & 0x1fffffff) != 0x1fffffff)) {
    Gia_ObjComputeTruthTable6_rec(p,pObj + -(ulong)(uVar8 & 0x1fffffff),vTruths);
    Gia_ObjComputeTruthTable6_rec(p,pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff),vTruths)
    ;
    uVar4 = *(ulong *)pObj;
    uVar8 = pObj[-(uVar4 & 0x1fffffff)].Value;
    if ((-1 < (long)(int)uVar8) && (uVar1 = vTruths->nSize, (int)uVar8 < (int)uVar1)) {
      uVar2 = pObj[-(ulong)((uint)(uVar4 >> 0x20) & 0x1fffffff)].Value;
      if ((-1 < (long)(int)uVar2) && ((int)uVar2 < (int)uVar1)) {
        uVar5 = vTruths->pArray[(int)uVar8];
        uVar6 = vTruths->pArray[(int)uVar2];
        pObj->Value = uVar1;
        Vec_WrdPush(vTruths,((long)(uVar4 << 2) >> 0x3f ^ uVar6) &
                            ((long)((int)uVar4 * 4 >> 0x1f) ^ uVar5));
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                  ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaTruth.c"
                ,0x6e,"void Gia_ObjComputeTruthTable6_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Wrd_t *)");
}

Assistant:

void Gia_ObjComputeTruthTable6_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Wrd_t * vTruths )
{
    word uTruth0, uTruth1;
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( !pObj->fMark0 );
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ObjComputeTruthTable6_rec( p, Gia_ObjFanin0(pObj), vTruths );
    Gia_ObjComputeTruthTable6_rec( p, Gia_ObjFanin1(pObj), vTruths );
    uTruth0 = Vec_WrdEntry( vTruths, Gia_ObjFanin0(pObj)->Value );
    uTruth0 = Gia_ObjFaninC0(pObj) ? ~uTruth0 : uTruth0;
    uTruth1 = Vec_WrdEntry( vTruths, Gia_ObjFanin1(pObj)->Value );
    uTruth1 = Gia_ObjFaninC1(pObj) ? ~uTruth1 : uTruth1;
    pObj->Value = Vec_WrdSize(vTruths);
    Vec_WrdPush( vTruths, uTruth0 & uTruth1 );
}